

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_recursive_cte.cpp
# Opt level: O1

void __thiscall duckdb::RecursiveCTEState::~RecursiveCTEState(RecursiveCTEState *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer puVar1;
  _Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false> _Var2;
  
  (this->super_GlobalSinkState)._vptr_GlobalSinkState =
       (_func_int **)&PTR__RecursiveCTEState_024aaf88;
  TupleDataChunkState::~TupleDataChunkState(&(this->ht_scan_state).scan_states.chunk_state);
  ::std::
  vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
  ::~vector((vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
             *)&(this->ht_scan_state).scan_states.pin_state.heap_handles);
  ::std::
  vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
  ::~vector((vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
             *)&(this->ht_scan_state).scan_states);
  this_00 = (this->new_groups).selection_data.internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  puVar1 = (this->scan_state).column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>
           .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&this->scan_state);
  ColumnDataCollection::~ColumnDataCollection(&this->intermediate_table);
  _Var2._M_head_impl =
       (this->ht).
       super_unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::GroupedAggregateHashTable_*,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
       .super__Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false>._M_head_impl;
  if (_Var2._M_head_impl != (GroupedAggregateHashTable *)0x0) {
    (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseAggregateHashTable + 8))();
  }
  (this->ht).
  super_unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::GroupedAggregateHashTable_*,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
  .super__Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false>._M_head_impl =
       (GroupedAggregateHashTable *)0x0;
  ::std::vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>::~vector
            (&(this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
              super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>);
  operator_delete(this);
  return;
}

Assistant:

explicit RecursiveCTEState(ClientContext &context, const PhysicalRecursiveCTE &op)
	    : intermediate_table(context, op.GetTypes()), new_groups(STANDARD_VECTOR_SIZE) {

		vector<BoundAggregateExpression *> payload_aggregates_ptr;
		for (idx_t i = 0; i < op.payload_aggregates.size(); i++) {
			auto &dat = op.payload_aggregates[i];
			payload_aggregates_ptr.push_back(dat.get());
		}

		ht = make_uniq<GroupedAggregateHashTable>(context, BufferAllocator::Get(context), op.distinct_types,
		                                          op.payload_types, payload_aggregates_ptr);
	}